

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_cl(DisasContext_conflict6 *ctx,uint32_t opc,int rd,int rs)

{
  TCGContext_conflict6 *tcg_ctx_00;
  TCGv_i64 t;
  TCGv_i64 t0;
  TCGContext_conflict6 *tcg_ctx;
  int rs_local;
  int rd_local;
  uint32_t opc_local;
  DisasContext_conflict6 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  if (rd == 0) {
    return;
  }
  t = tcg_ctx_00->cpu_gpr[rd];
  gen_load_gpr(tcg_ctx_00,t,rs);
  if ((((opc == 0x11) || (opc == 0x13)) || (opc == 0x70000021)) || (opc == 0x70000025)) {
    tcg_gen_not_i64_mips64el(tcg_ctx_00,t,t);
  }
  if (opc - 0x10 < 2) {
LAB_00d1d755:
    tcg_gen_ext32u_i64_mips64el(tcg_ctx_00,t,t);
    tcg_gen_clzi_i64_mips64el(tcg_ctx_00,t,t,0x40);
    tcg_gen_subi_i64_mips64el(tcg_ctx_00,t,t,0x20);
  }
  else {
    if (1 < opc - 0x12) {
      if (opc + 0x8fffffe0 < 2) goto LAB_00d1d755;
      if (1 < opc + 0x8fffffdc) {
        return;
      }
    }
    tcg_gen_clzi_i64_mips64el(tcg_ctx_00,t,t,0x40);
  }
  return;
}

Assistant:

static void gen_cl(DisasContext *ctx, uint32_t opc,
                   int rd, int rs)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t0;

    if (rd == 0) {
        /* Treat as NOP. */
        return;
    }
    t0 = tcg_ctx->cpu_gpr[rd];
    gen_load_gpr(tcg_ctx, t0, rs);

    switch (opc) {
    case OPC_CLO:
    case R6_OPC_CLO:
#if defined(TARGET_MIPS64)
    case OPC_DCLO:
    case R6_OPC_DCLO:
#endif
        tcg_gen_not_tl(tcg_ctx, t0, t0);
        break;
    }

    switch (opc) {
    case OPC_CLO:
    case R6_OPC_CLO:
    case OPC_CLZ:
    case R6_OPC_CLZ:
        tcg_gen_ext32u_tl(tcg_ctx, t0, t0);
        tcg_gen_clzi_tl(tcg_ctx, t0, t0, TARGET_LONG_BITS);
        tcg_gen_subi_tl(tcg_ctx, t0, t0, TARGET_LONG_BITS - 32);
        break;
#if defined(TARGET_MIPS64)
    case OPC_DCLO:
    case R6_OPC_DCLO:
    case OPC_DCLZ:
    case R6_OPC_DCLZ:
        tcg_gen_clzi_i64(tcg_ctx, t0, t0, 64);
        break;
#endif
    }
}